

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

longlong __thiscall Omega_h::InputScalar::get<long_long>(InputScalar *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Omega_h local_38 [8];
  string full_name;
  longlong local_18;
  longlong out;
  InputScalar *this_local;
  
  out = (longlong)this;
  bVar1 = as(this,&local_18);
  if (!bVar1) {
    get_full_name_abi_cxx11_(local_38,&this->super_Input);
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    fail("InputScalar \"%s\" string \"%s\" is not interpretable as a %s",uVar2,uVar3,"long long");
  }
  return local_18;
}

Assistant:

T InputScalar::get() const {
  T out;
  if (!as(out)) {
    auto full_name = get_full_name(*this);
    Omega_h_fail(
        "InputScalar \"%s\" string \"%s\" is not interpretable as a %s",
        full_name.c_str(), str.c_str(),
        (std::is_same<T, int>::value
                ? "int"
                : (std::is_same<T, double>::value
                          ? "double"
                          : (std::is_same<T, long long>::value
                                    ? "long long"
                                    : "unknown type"))));
  }
  return out;
}